

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bddisasm_crt.c
# Opt level: O3

char * nd_strcat_s(char *dst,ND_SIZET dst_size,char *src)

{
  char cVar1;
  ND_SIZET NVar2;
  char *pcVar3;
  ND_SIZET NVar4;
  bool bVar5;
  
  NVar2 = dst_size;
  pcVar3 = dst;
  if (dst_size != 0) {
    do {
      if (*pcVar3 == '\0') {
        NVar4 = 1;
        goto LAB_0015fb7b;
      }
      NVar2 = NVar2 - 1;
      pcVar3 = pcVar3 + 1;
    } while (NVar2 != 0);
  }
  goto LAB_0015fb9b;
  while (bVar5 = NVar2 != NVar4, NVar4 = NVar4 + 1, bVar5) {
LAB_0015fb7b:
    cVar1 = src[NVar4 - 1];
    pcVar3[NVar4 - 1] = cVar1;
    if (cVar1 == '\0') break;
  }
  if (cVar1 == '\0') {
    return dst;
  }
LAB_0015fb9b:
  memset(dst,0,dst_size);
  return (char *)0x0;
}

Assistant:

char *
nd_strcat_s(
    char *dst,
    ND_SIZET dst_size,
    const char *src
    )
{
    char *p;
    ND_SIZET available;

    p = dst;
    available = dst_size;
    while (available > 0 && *p != 0)
    {
        p++;
        available--;
    }

    if (available == 0)
    {
        nd_memzero(dst, dst_size);
        return (char *)ND_NULL;
    }

    while ((*p++ = *src++) != 0 && --available > 0);

    if (available == 0)
    {
        nd_memzero(dst, dst_size);
        return (char *)ND_NULL;
    }

    return dst;
}